

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.hpp
# Opt level: O2

matrix<double> *
mat_lib::operator*(matrix<double> *__return_storage_ptr__,matrix<double> *a,matrix<double> *b)

{
  size_t sVar1;
  size_t sVar2;
  element_t *peVar3;
  size_t sVar4;
  size_t sVar5;
  element_t *peVar6;
  ostream *poVar7;
  invalid_argument *this;
  long lVar8;
  size_t sVar9;
  long lVar10;
  long lVar11;
  size_t sVar12;
  double *pdVar13;
  size_t sVar14;
  double dVar15;
  string local_1c8 [32];
  ostringstream str_stream;
  
  if (a->columns__ == b->rows__) {
    matrix<double>::matrix(__return_storage_ptr__,a->rows__,b->columns__);
    sVar1 = __return_storage_ptr__->rows__;
    sVar2 = __return_storage_ptr__->columns__;
    lVar8 = 0;
    for (sVar9 = 0; sVar9 != sVar1; sVar9 = sVar9 + 1) {
      lVar10 = sVar2 * sVar9;
      peVar3 = __return_storage_ptr__->elements__;
      sVar4 = a->columns__;
      lVar11 = 0;
      for (sVar12 = 0; sVar12 != sVar2; sVar12 = sVar12 + 1) {
        peVar3[lVar10 + sVar12] = 0.0;
        sVar5 = b->columns__;
        pdVar13 = (double *)((long)b->elements__ + lVar11);
        peVar6 = a->elements__;
        dVar15 = 0.0;
        for (sVar14 = 0; sVar4 != sVar14; sVar14 = sVar14 + 1) {
          dVar15 = dVar15 + *(double *)((long)peVar6 + sVar14 * 8 + sVar4 * lVar8) * *pdVar13;
          peVar3[lVar10 + sVar12] = dVar15;
          pdVar13 = pdVar13 + sVar5;
        }
        lVar11 = lVar11 + 8;
      }
      lVar8 = lVar8 + 8;
    }
    return __return_storage_ptr__;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&str_stream);
  poVar7 = std::operator<<((ostream *)&str_stream,"size mismatch! cannot multiple matrices (");
  poVar7 = std::operator<<(poVar7,"operator*");
  poVar7 = std::operator<<(poVar7,"() in ");
  poVar7 = std::operator<<(poVar7,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/miguel-kjh[P]MatLibraryPy/matrix.hpp"
                          );
  poVar7 = std::operator<<(poVar7,":");
  poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0x23f);
  std::operator<<(poVar7,")");
  this = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::invalid_argument::invalid_argument(this,local_1c8);
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

size_t columns() const { return columns__; }